

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O0

void snga_add_patch_values
               (Integer type,void *alpha,void *beta,Integer ndim,Integer *loC,Integer *hiC,
               Integer *ldC,void *A_ptr,void *B_ptr,void *C_ptr)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  double *pdVar11;
  long in_RCX;
  double *in_RDX;
  double *in_RSI;
  undefined8 in_RDI;
  long *in_R8;
  long *in_R9;
  long *in_stack_00000008;
  SingleComplex y_1;
  SingleComplex x_1;
  SingleComplex b_1;
  SingleComplex a_1;
  DoubleComplex y;
  DoubleComplex x;
  DoubleComplex b;
  DoubleComplex a;
  Integer j;
  Integer i;
  Integer n1dim;
  Integer idx;
  Integer baseldC [7];
  Integer bunit [7];
  Integer bvalue [7];
  float local_168;
  float fStack_164;
  float local_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float local_150;
  float fStack_14c;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8 [8];
  long local_a8 [8];
  long local_68 [7];
  long *local_30;
  long *local_28;
  long local_20;
  double *local_18;
  double *local_10;
  undefined8 local_8;
  
  local_f8 = 1;
  for (local_100 = 1; local_100 < in_RCX; local_100 = local_100 + 1) {
    local_f8 = ((in_R9[local_100] - in_R8[local_100]) + 1) * local_f8;
  }
  local_68[0] = 0;
  local_68[1] = 0;
  local_a8[0] = 1;
  local_a8[1] = 1;
  local_e8[0] = *in_stack_00000008;
  local_e8[1] = *in_stack_00000008 * in_stack_00000008[1];
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_100 = 2; local_100 < local_20; local_100 = local_100 + 1) {
    local_68[local_100] = 0;
    local_a8[local_100] =
         local_a8[local_100 + -1] * ((local_30[local_100 + -1] - local_28[local_100 + -1]) + 1);
    local_e8[local_100] = local_e8[local_100 + -1] * in_stack_00000008[local_100];
  }
  switch(local_8) {
  case 0x3e9:
    for (local_100 = 0; local_100 < local_f8; local_100 = local_100 + 1) {
      local_f0 = 0;
      for (local_108 = 1; local_108 < local_20; local_108 = local_108 + 1) {
        local_f0 = local_68[local_108] * local_e8[local_108 + -1] + local_f0;
        if ((local_100 + 1) % local_a8[local_108] == 0) {
          local_68[local_108] = local_68[local_108] + 1;
        }
        if (local_30[local_108] - local_28[local_108] < local_68[local_108]) {
          local_68[local_108] = 0;
        }
      }
      for (local_108 = 0; local_108 < (*local_30 - *local_28) + 1; local_108 = local_108 + 1) {
        *(int *)((long)b_1 + (local_f0 + local_108) * 4) =
             (int)*(float *)local_10 * *(int *)((long)y_1 + (local_f0 + local_108) * 4) +
             (int)*(float *)local_18 * *(int *)((long)x_1 + (local_f0 + local_108) * 4);
      }
    }
    break;
  case 0x3ea:
    for (local_100 = 0; local_100 < local_f8; local_100 = local_100 + 1) {
      local_f0 = 0;
      for (local_108 = 1; local_108 < local_20; local_108 = local_108 + 1) {
        local_f0 = local_68[local_108] * local_e8[local_108 + -1] + local_f0;
        if ((local_100 + 1) % local_a8[local_108] == 0) {
          local_68[local_108] = local_68[local_108] + 1;
        }
        if (local_30[local_108] - local_28[local_108] < local_68[local_108]) {
          local_68[local_108] = 0;
        }
      }
      for (local_108 = 0; local_108 < (*local_30 - *local_28) + 1; local_108 = local_108 + 1) {
        *(long *)((long)b_1 + (local_f0 + local_108) * 8) =
             (long)*local_10 * *(long *)((long)y_1 + (local_f0 + local_108) * 8) +
             (long)*local_18 * *(long *)((long)x_1 + (local_f0 + local_108) * 8);
      }
    }
    break;
  case 0x3eb:
    for (local_100 = 0; local_100 < local_f8; local_100 = local_100 + 1) {
      local_f0 = 0;
      for (local_108 = 1; local_108 < local_20; local_108 = local_108 + 1) {
        local_f0 = local_68[local_108] * local_e8[local_108 + -1] + local_f0;
        if ((local_100 + 1) % local_a8[local_108] == 0) {
          local_68[local_108] = local_68[local_108] + 1;
        }
        if (local_30[local_108] - local_28[local_108] < local_68[local_108]) {
          local_68[local_108] = 0;
        }
      }
      for (local_108 = 0; local_108 < (*local_30 - *local_28) + 1; local_108 = local_108 + 1) {
        *(float *)((long)b_1 + (local_f0 + local_108) * 4) =
             *(float *)local_10 * *(float *)((long)y_1 + (local_f0 + local_108) * 4) +
             *(float *)local_18 * *(float *)((long)x_1 + (local_f0 + local_108) * 4);
      }
    }
    break;
  case 0x3ec:
    for (local_100 = 0; local_100 < local_f8; local_100 = local_100 + 1) {
      local_f0 = 0;
      for (local_108 = 1; local_108 < local_20; local_108 = local_108 + 1) {
        local_f0 = local_68[local_108] * local_e8[local_108 + -1] + local_f0;
        if ((local_100 + 1) % local_a8[local_108] == 0) {
          local_68[local_108] = local_68[local_108] + 1;
        }
        if (local_30[local_108] - local_28[local_108] < local_68[local_108]) {
          local_68[local_108] = 0;
        }
      }
      for (local_108 = 0; local_108 < (*local_30 - *local_28) + 1; local_108 = local_108 + 1) {
        *(double *)((long)b_1 + (local_f0 + local_108) * 8) =
             *local_10 * *(double *)((long)y_1 + (local_f0 + local_108) * 8) +
             *local_18 * *(double *)((long)x_1 + (local_f0 + local_108) * 8);
      }
    }
    break;
  default:
    pnga_error((char *)y.real,(Integer)a_1);
    break;
  case 0x3ee:
    for (local_100 = 0; local_100 < local_f8; local_100 = local_100 + 1) {
      local_f0 = 0;
      for (local_108 = 1; local_108 < local_20; local_108 = local_108 + 1) {
        local_f0 = local_68[local_108] * local_e8[local_108 + -1] + local_f0;
        if ((local_100 + 1) % local_a8[local_108] == 0) {
          local_68[local_108] = local_68[local_108] + 1;
        }
        if (local_30[local_108] - local_28[local_108] < local_68[local_108]) {
          local_68[local_108] = 0;
        }
      }
      for (local_108 = 0; local_108 < (*local_30 - *local_28) + 1; local_108 = local_108 + 1) {
        uVar9 = *(undefined8 *)((long)y_1 + (local_f0 + local_108) * 8);
        uVar10 = *(undefined8 *)((long)x_1 + (local_f0 + local_108) * 8);
        local_160 = SUB84(*local_10,0);
        local_150 = (float)uVar9;
        fStack_15c = (float)((ulong)*local_10 >> 0x20);
        fStack_14c = (float)((ulong)uVar9 >> 0x20);
        local_168 = SUB84(*local_18,0);
        local_158 = (float)uVar10;
        fStack_164 = (float)((ulong)*local_18 >> 0x20);
        fStack_154 = (float)((ulong)uVar10 >> 0x20);
        *(float *)((long)b_1 + (local_f0 + local_108) * 8) =
             -fStack_164 * fStack_154 +
             local_168 * local_158 + local_160 * local_150 + -(fStack_15c * fStack_14c);
        *(float *)((long)b_1 + 4 + (local_f0 + local_108) * 8) =
             fStack_164 * local_158 +
             local_168 * fStack_154 + local_160 * fStack_14c + fStack_15c * local_150;
      }
    }
    break;
  case 0x3ef:
    for (local_100 = 0; local_100 < local_f8; local_100 = local_100 + 1) {
      local_f0 = 0;
      for (local_108 = 1; local_108 < local_20; local_108 = local_108 + 1) {
        local_f0 = local_68[local_108] * local_e8[local_108 + -1] + local_f0;
        if ((local_100 + 1) % local_a8[local_108] == 0) {
          local_68[local_108] = local_68[local_108] + 1;
        }
        if (local_30[local_108] - local_28[local_108] < local_68[local_108]) {
          local_68[local_108] = 0;
        }
      }
      for (local_108 = 0; local_108 < (*local_30 - *local_28) + 1; local_108 = local_108 + 1) {
        pdVar11 = (double *)((long)y_1 + (local_f0 + local_108) * 0x10);
        dVar1 = *pdVar11;
        dVar2 = pdVar11[1];
        pdVar11 = (double *)((long)x_1 + (local_f0 + local_108) * 0x10);
        dVar3 = *pdVar11;
        dVar4 = pdVar11[1];
        dVar5 = *local_10;
        dVar6 = local_10[1];
        dVar7 = *local_18;
        dVar8 = local_18[1];
        *(double *)((long)b_1 + (local_f0 + local_108) * 0x10) =
             -dVar8 * dVar4 + dVar7 * dVar3 + dVar5 * dVar1 + -(dVar6 * dVar2);
        *(double *)((long)b_1 + (local_f0 + local_108) * 0x10 + 8) =
             dVar8 * dVar3 + dVar7 * dVar4 + dVar5 * dVar2 + dVar6 * dVar1;
      }
    }
    break;
  case 0x3f8:
    for (local_100 = 0; local_100 < local_f8; local_100 = local_100 + 1) {
      local_f0 = 0;
      for (local_108 = 1; local_108 < local_20; local_108 = local_108 + 1) {
        local_f0 = local_68[local_108] * local_e8[local_108 + -1] + local_f0;
        if ((local_100 + 1) % local_a8[local_108] == 0) {
          local_68[local_108] = local_68[local_108] + 1;
        }
        if (local_30[local_108] - local_28[local_108] < local_68[local_108]) {
          local_68[local_108] = 0;
        }
      }
      for (local_108 = 0; local_108 < (*local_30 - *local_28) + 1; local_108 = local_108 + 1) {
        *(long *)((long)b_1 + (local_f0 + local_108) * 8) =
             (long)*local_10 * *(long *)((long)y_1 + (local_f0 + local_108) * 8) +
             (long)*local_18 * *(long *)((long)x_1 + (local_f0 + local_108) * 8);
      }
    }
  }
  return;
}

Assistant:

static void snga_add_patch_values(Integer type, void* alpha, void *beta,
                           Integer ndim, Integer *loC, Integer *hiC, Integer *ldC,
                           void *A_ptr, void *B_ptr, void *C_ptr)
{
  Integer bvalue[MAXDIM], bunit[MAXDIM], baseldC[MAXDIM];
  Integer idx, n1dim;
  Integer i, j;
  /* compute "local" add */

  /* number of n-element of the first dimension */
  n1dim = 1; for(i=1; i<ndim; i++) n1dim *= (hiC[i] - loC[i] + 1);

  /* calculate the destination indices */
  bvalue[0] = 0; bvalue[1] = 0; bunit[0] = 1; bunit[1] = 1;
  /* baseld[0] = ld[0]
   * baseld[1] = ld[0] * ld[1]
   * baseld[2] = ld[0] * ld[1] * ld[2] .....
   */
  baseldC[0] = ldC[0]; baseldC[1] = baseldC[0] *ldC[1];
  for(i=2; i<ndim; i++) {
    bvalue[i] = 0;
    bunit[i] = bunit[i-1] * (hiC[i-1] - loC[i-1] + 1);
    baseldC[i] = baseldC[i-1] * ldC[i];
  }

  switch(type){
    case C_DBL:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++)
          ((double*)C_ptr)[idx+j] =
            *(double*)alpha *
            ((double*)A_ptr)[idx+j] +
            *(double*)beta *
            ((double*)B_ptr)[idx+j];
      }
      break;
    case C_DCPL:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++) {
          DoubleComplex a = ((DoubleComplex *)A_ptr)[idx+j];
          DoubleComplex b = ((DoubleComplex *)B_ptr)[idx+j];
          DoubleComplex x= *(DoubleComplex*)alpha;
          DoubleComplex y= *(DoubleComplex*)beta;
          ((DoubleComplex *)C_ptr)[idx+j].real = x.real*a.real -
            x.imag*a.imag + y.real*b.real - y.imag*b.imag;
          ((DoubleComplex *)C_ptr)[idx+j].imag = x.real*a.imag +
            x.imag*a.real + y.real*b.imag + y.imag*b.real;
        }
      }
      break;
    case C_SCPL:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++) {
          SingleComplex a = ((SingleComplex *)A_ptr)[idx+j];
          SingleComplex b = ((SingleComplex *)B_ptr)[idx+j];
          SingleComplex x= *(SingleComplex*)alpha;
          SingleComplex y= *(SingleComplex*)beta;
          ((SingleComplex *)C_ptr)[idx+j].real = x.real*a.real -
            x.imag*a.imag + y.real*b.real - y.imag*b.imag;
          ((SingleComplex *)C_ptr)[idx+j].imag = x.real*a.imag +
            x.imag*a.real + y.real*b.imag + y.imag*b.real;
        }
      }
      break;
    case C_INT:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++)
          ((int*)C_ptr)[idx+j] = *(int *)alpha *
            ((int*)A_ptr)[idx+j] + *(int*)beta *
            ((int*)B_ptr)[idx+j];
      }
      break;
    case C_FLOAT:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++)
          ((float *)C_ptr)[idx+j] = *(float *)alpha *
            ((float *)A_ptr)[idx+j] + *(float *)beta *
            ((float *)B_ptr)[idx+j];
      }
      break;
    case C_LONG:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++)
          ((long *)C_ptr)[idx+j] = *(long *)alpha *
            ((long *)A_ptr)[idx+j] + *(long *)beta *
            ((long *)B_ptr)[idx+j];
      }
      break;
    case C_LONGLONG:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++)
          ((long long*)C_ptr)[idx+j] = *(long long*)alpha *
            ((long long*)A_ptr)[idx+j] + *(long long*)beta *
            ((long long*)B_ptr)[idx+j];
      }
      break;
    default: pnga_error(" wrong data type ",type);
  }
}